

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkStrash.c
# Opt level: O2

Aig_Obj_t * Nwk_ManStrashNode(Aig_Man_t *p,Nwk_Obj_t *pObj)

{
  Hop_Man_t *p_00;
  Hop_Obj_t *pHVar1;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar2;
  Hop_Obj_t *pHVar3;
  long lVar4;
  Hop_Obj_t *pObj_00;
  
  if ((*(uint *)&pObj->field_0x20 & 7) == 3) {
    p_00 = pObj->pMan->pManHop;
    pHVar1 = pObj->pFunc;
    pObj_00 = (Hop_Obj_t *)((ulong)pHVar1 & 0xfffffffffffffffe);
    if (p_00->pConst1 == pObj_00) {
      pObj_00 = (Hop_Obj_t *)&p->pConst1;
    }
    else {
      for (lVar4 = 0; (lVar4 < pObj->nFanins && (pObj->pFanio[lVar4] != (Nwk_Obj_t *)0x0));
          lVar4 = lVar4 + 1) {
        aVar2 = (anon_union_8_2_00a17ec8_for_Hop_Obj_t__0)pObj->pFanio[lVar4]->pCopy;
        pHVar3 = Hop_IthVar(p_00,(int)lVar4);
        pHVar3->field_0 = aVar2;
      }
      Nwk_ManStrashNode_rec(p,pObj_00);
      Hop_ConeUnmark_rec(pObj_00);
    }
    return (Aig_Obj_t *)((ulong)((uint)pHVar1 & 1) ^ (ulong)(pObj_00->field_0).pData);
  }
  __assert_fail("Nwk_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkStrash.c"
                ,0x4a,"Aig_Obj_t *Nwk_ManStrashNode(Aig_Man_t *, Nwk_Obj_t *)");
}

Assistant:

Aig_Obj_t * Nwk_ManStrashNode( Aig_Man_t * p, Nwk_Obj_t * pObj )
{
    Hop_Man_t * pMan = pObj->pMan->pManHop;
    Hop_Obj_t * pRoot = pObj->pFunc;
    Nwk_Obj_t * pFanin;
    int i;
    assert( Nwk_ObjIsNode(pObj) );
    // check the constant case
    if ( Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return Aig_NotCond( Aig_ManConst1(p), Hop_IsComplement(pRoot) );
    // set elementary variables
    Nwk_ObjForEachFanin( pObj, pFanin, i )
        Hop_IthVar(pMan, i)->pData = pFanin->pCopy;
    // strash the AIG of this node
    Nwk_ManStrashNode_rec( p, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the final node
    return Aig_NotCond( (Aig_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}